

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::LoadScalarVar
          (InterfaceVariableScalarReplacement *this,Instruction *scalar_var,
          uint32_t *extra_array_index,Instruction *insert_before)

{
  uint32_t id;
  int iVar1;
  TypeManager *this_00;
  Type *pTVar2;
  undefined4 extraout_var;
  Instruction *pIVar3;
  
  id = GetPointeeTypeIdOfVar(this,scalar_var);
  if (extra_array_index != (uint32_t *)0x0) {
    this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
    pTVar2 = analysis::TypeManager::GetType(this_00,id);
    iVar1 = (*pTVar2->_vptr_Type[0x17])(pTVar2);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      __assert_fail("array_type != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                    ,0x27a,
                    "Instruction *spvtools::opt::InterfaceVariableScalarReplacement::LoadScalarVar(Instruction *, const uint32_t *, Instruction *)"
                   );
    }
    id = analysis::TypeManager::GetTypeInstruction
                   (this_00,*(Type **)(CONCAT44(extraout_var,iVar1) + 0x28));
    scalar_var = CreateAccessChainWithIndex(this,id,scalar_var,*extra_array_index,insert_before);
  }
  pIVar3 = CreateLoad(this,id,scalar_var,insert_before);
  return pIVar3;
}

Assistant:

Instruction* InterfaceVariableScalarReplacement::LoadScalarVar(
    Instruction* scalar_var, const uint32_t* extra_array_index,
    Instruction* insert_before) {
  uint32_t component_type_id = GetPointeeTypeIdOfVar(scalar_var);
  Instruction* ptr = scalar_var;
  if (extra_array_index) {
    auto* ty_mgr = context()->get_type_mgr();
    analysis::Array* array_type = ty_mgr->GetType(component_type_id)->AsArray();
    assert(array_type != nullptr);
    component_type_id = ty_mgr->GetTypeInstruction(array_type->element_type());
    ptr = CreateAccessChainWithIndex(component_type_id, scalar_var,
                                     *extra_array_index, insert_before);
  }

  return CreateLoad(component_type_id, ptr, insert_before);
}